

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O2

size_t stumpless_get_element_index(stumpless_entry *entry,char *name)

{
  stumpless_element *element;
  _Bool _Var1;
  int iVar2;
  char *message;
  size_t sVar3;
  size_t name_len;
  size_t local_30;
  
  if (entry == (stumpless_entry *)0x0) {
    message = "entry was NULL";
  }
  else {
    if (name != (char *)0x0) {
      _Var1 = validate_element_name(name,&local_30);
      if (!_Var1) {
        return 0;
      }
      lock_entry(entry);
      sVar3 = 0;
      do {
        if (entry->element_count <= sVar3) {
          raise_element_not_found();
          sVar3 = 0;
LAB_0010b8cc:
          unlock_entry(entry);
          return sVar3;
        }
        element = entry->elements[sVar3];
        lock_element(element);
        iVar2 = bcmp(element,name,local_30);
        unlock_element(element);
        if (iVar2 == 0) {
          clear_error();
          goto LAB_0010b8cc;
        }
        sVar3 = sVar3 + 1;
      } while( true );
    }
    message = "name was NULL";
  }
  raise_argument_empty(message);
  return 0;
}

Assistant:

size_t
stumpless_get_element_index( const struct stumpless_entry *entry,
                             const char *name ) {
  size_t name_len;
  size_t i;
  const struct stumpless_element *element;
  int cmp_result;

  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( entry );
  VALIDATE_ARG_NOT_NULL_UNSIGNED_RETURN( name );

  if ( unlikely( !validate_element_name( name, &name_len ) ) ) {
    return 0;
  }

  lock_entry( entry );
  for( i = 0; i < entry->element_count; i++ ) {
    element = entry->elements[i];

    lock_element( element );
    cmp_result = memcmp( element->name, name, name_len );
    unlock_element( element );

    if( cmp_result == 0 ) {
      clear_error(  );
      goto cleanup_and_return;
    }
  }

  i = 0;
  raise_element_not_found(  );

cleanup_and_return:
  unlock_entry( entry );
  return i;
}